

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFns.c
# Opt level: O2

newtRef NsExtractWord(newtRefArg rcvr,newtRefArg r,newtRefArg offset)

{
  _Bool _Var1;
  uint32_t uVar2;
  ulong uVar3;
  void *pvVar4;
  newtRef nVar5;
  int32_t err;
  long lVar6;
  
  _Var1 = NewtRefIsBinary(r);
  if (_Var1) {
    _Var1 = NewtRefIsInteger(offset);
    if (_Var1) {
      uVar2 = NewtBinaryLength(r);
      uVar3 = NewtRefToInteger(offset);
      if (((uint)uVar3 < uVar2) && (lVar6 = (uVar3 & 0xffffffff) + 1, (uint)lVar6 < uVar2)) {
        pvVar4 = NewtRefToData(r);
        nVar5 = NewtMakeInteger((ulong)CONCAT11(*(undefined1 *)((long)pvVar4 + (uVar3 & 0xffffffff))
                                                ,*(undefined1 *)((long)pvVar4 + lVar6)));
        return nVar5;
      }
      return 0xfff2;
    }
    err = -0xbd16;
  }
  else {
    err = -0xbd18;
    offset = r;
  }
  nVar5 = NewtThrow(err,offset);
  return nVar5;
}

Assistant:

newtRef NsExtractWord(newtRefArg rcvr, newtRefArg r, newtRefArg offset)
{
    if (! NewtRefIsBinary(r))
        return NewtThrow(kNErrNotABinaryObject, r);
    
    if (! NewtRefIsInteger(offset))
        return NewtThrow(kNErrNotAnInteger, offset);
    
    uint32_t len = NewtBinaryLength(r);
    uint32_t p = (uint32_t)NewtRefToInteger(offset);
    
    if (p < len && p + 1 < len)
    {
        uint8_t *	data = NewtRefToBinary(r);
        uint32_t value = (data[p] << 8) | (data[p+1]);
        return NewtMakeInteger(value);
    }
    
    return kNewtRefUnbind;
    
}